

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Capturer::~Capturer(Capturer *this)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  bVar1 = uncaught_exceptions();
  if (!bVar1) {
    uVar2 = this->m_captured;
    if (uVar2 != ((long)(this->m_messages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_messages).
                       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x48) {
      __assert_fail("m_captured == m_messages.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
                    ,0x2e97,"Catch::Capturer::~Capturer()");
    }
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      (*this->m_resultCapture->_vptr_IResultCapture[0xb])
                (this->m_resultCapture,
                 (long)&(((this->m_messages).
                          super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start)->macroName).m_start + lVar3);
      uVar2 = this->m_captured;
      lVar3 = lVar3 + 0x48;
    }
  }
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->m_messages);
  return;
}

Assistant:

Capturer::~Capturer() {
        if ( !uncaught_exceptions() ){
            assert( m_captured == m_messages.size() );
            for( size_t i = 0; i < m_captured; ++i  )
                m_resultCapture.popScopedMessage( m_messages[i] );
        }
    }